

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_bit_encoder.h
# Opt level: O2

void __thiscall
draco::DirectBitEncoder::EncodeLeastSignificantBits32
          (DirectBitEncoder *this,int nbits,uint32_t value)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  
  uVar1 = this->num_local_bits_;
  uVar2 = value << (-(char)nbits & 0x1fU);
  uVar3 = nbits - (0x20 - uVar1);
  if (uVar3 == 0 || nbits < (int)(0x20 - uVar1)) {
    this->local_bits_ = this->local_bits_ | uVar2 >> ((byte)uVar1 & 0x1f);
    this->num_local_bits_ = nbits + uVar1;
    if (nbits + uVar1 == 0x20) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->bits_,&this->local_bits_);
      this->local_bits_ = 0;
      this->num_local_bits_ = 0;
    }
  }
  else {
    uVar2 = uVar2 >> (0x20U - (char)nbits & 0x1f);
    this->num_local_bits_ = uVar3;
    this->local_bits_ = this->local_bits_ | uVar2 >> ((byte)uVar3 & 0x1f);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->bits_,&this->local_bits_);
    this->local_bits_ = uVar2 << (-(char)this->num_local_bits_ & 0x1fU);
  }
  return;
}

Assistant:

void EncodeLeastSignificantBits32(int nbits, uint32_t value) {
    DRACO_DCHECK_EQ(true, nbits <= 32);
    DRACO_DCHECK_EQ(true, nbits > 0);

    const int remaining = 32 - num_local_bits_;

    // Make sure there are no leading bits that should not be encoded and
    // start from here.
    value = value << (32 - nbits);
    if (nbits <= remaining) {
      value = value >> num_local_bits_;
      local_bits_ = local_bits_ | value;
      num_local_bits_ += nbits;
      if (num_local_bits_ == 32) {
        bits_.push_back(local_bits_);
        local_bits_ = 0;
        num_local_bits_ = 0;
      }
    } else {
      value = value >> (32 - nbits);
      num_local_bits_ = nbits - remaining;
      const uint32_t value_l = value >> num_local_bits_;
      local_bits_ = local_bits_ | value_l;
      bits_.push_back(local_bits_);
      local_bits_ = value << (32 - num_local_bits_);
    }
  }